

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O0

bool BoundedToBoundedCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  int32_t iVar1;
  int32_t iVar2;
  ConversionException *this;
  LogicalType *pLVar3;
  LogicalType *pLVar4;
  Vector *in_RSI;
  Vector *in_RDI;
  int32_t output_max_val;
  int32_t input_max_val;
  
  duckdb::Vector::GetType(in_RDI);
  iVar1 = BoundedType::GetMaxValue(_output_max_val);
  duckdb::Vector::GetType(in_RSI);
  iVar2 = BoundedType::GetMaxValue(_output_max_val);
  if (iVar1 <= iVar2) {
    duckdb::Vector::Reinterpret(in_RSI);
    return true;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  pLVar3 = duckdb::Vector::GetType(in_RDI);
  pLVar4 = duckdb::Vector::GetType(in_RSI);
  duckdb::ConversionException::ConversionException(this,pLVar3,pLVar4);
  __cxa_throw(this,&duckdb::ConversionException::typeinfo,
              duckdb::ConversionException::~ConversionException);
}

Assistant:

static bool BoundedToBoundedCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto input_max_val = BoundedType::GetMaxValue(source.GetType());
	auto output_max_val = BoundedType::GetMaxValue(result.GetType());

	if (input_max_val <= output_max_val) {
		result.Reinterpret(source);
		return true;
	} else {
		throw ConversionException(source.GetType(), result.GetType());
	}
}